

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

void __thiscall
doctest::anon_unknown_14::XmlReporter::test_case_end(XmlReporter *this,CurrentTestCaseStats *st)

{
  XmlWriter *this_00;
  allocator local_a4;
  allocator local_a3;
  allocator local_a2;
  allocator local_a1;
  string local_a0;
  int local_7c;
  string local_78;
  string local_58;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_a0,"OverallResultsAsserts",&local_a1);
  this_00 = &this->xml;
  XmlWriter::startElement(this_00,&local_a0);
  std::__cxx11::string::string((string *)&local_78,"successes",&local_a2);
  local_7c = st->numAssertsCurrentTest - st->numAssertsFailedCurrentTest;
  XmlWriter::writeAttribute<int>(this_00,&local_78,&local_7c);
  std::__cxx11::string::string((string *)&local_38,"failures",&local_a3);
  XmlWriter::writeAttribute<int>(this_00,&local_38,&st->numAssertsFailedCurrentTest);
  std::__cxx11::string::string((string *)&local_58,"test_case_success",&local_a4);
  XmlWriter::writeAttribute(this_00,&local_58,st->testCaseSuccess);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_a0);
  if (this->opt->duration == true) {
    std::__cxx11::string::string((string *)&local_a0,"duration",(allocator *)&local_78);
    XmlWriter::writeAttribute<double>(this_00,&local_a0,&st->seconds);
    std::__cxx11::string::~string((string *)&local_a0);
  }
  if (this->tc->m_expected_failures != 0) {
    std::__cxx11::string::string((string *)&local_a0,"expected_failures",(allocator *)&local_78);
    XmlWriter::writeAttribute<int>(this_00,&local_a0,&this->tc->m_expected_failures);
    std::__cxx11::string::~string((string *)&local_a0);
  }
  XmlWriter::endElement(this_00);
  XmlWriter::endElement(this_00);
  return;
}

Assistant:

void test_case_end(const CurrentTestCaseStats& st) override {
            xml.startElement("OverallResultsAsserts")
                    .writeAttribute("successes",
                                    st.numAssertsCurrentTest - st.numAssertsFailedCurrentTest)
                    .writeAttribute("failures", st.numAssertsFailedCurrentTest)
                    .writeAttribute("test_case_success", st.testCaseSuccess);
            if(opt.duration)
                xml.writeAttribute("duration", st.seconds);
            if(tc->m_expected_failures)
                xml.writeAttribute("expected_failures", tc->m_expected_failures);
            xml.endElement();

            xml.endElement();
        }